

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_decoder__postinit(ma_decoder_config *pConfig,ma_decoder *pDecoder)

{
  ma_result mVar1;
  ma_result result;
  ma_decoder_config *in_stack_00000200;
  ma_decoder *in_stack_00000208;
  ma_decoder *in_stack_ffffffffffffffd8;
  
  mVar1 = ma_decoder__init_data_converter(in_stack_00000208,in_stack_00000200);
  if (mVar1 != MA_SUCCESS) {
    ma_decoder_uninit(in_stack_ffffffffffffffd8);
  }
  return mVar1;
}

Assistant:

static ma_result ma_decoder__postinit(const ma_decoder_config* pConfig, ma_decoder* pDecoder)
{
    ma_result result;

    result = ma_decoder__init_data_converter(pDecoder, pConfig);

    /* If we failed post initialization we need to uninitialize the decoder before returning to prevent a memory leak. */
    if (result != MA_SUCCESS) {
        ma_decoder_uninit(pDecoder);
        return result;
    }

    return result;
}